

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-fchmod.c
# Opt level: O0

int run_test_pipe_set_chmod(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  stat stat_buf;
  int r;
  uv_loop_t *loop;
  uv_pipe_t pipe_handle;
  
  loop_00 = (uv_loop_t *)uv_default_loop();
  stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_init(loop_00,&loop,0);
  if ((long)stat_buf.__glibc_reserved[2]._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
            ,0x26,"r","==","0",(long)stat_buf.__glibc_reserved[2]._4_4_,"==",0);
    abort();
  }
  stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_bind(&loop,"/tmp/uv-test-sock");
  if ((long)stat_buf.__glibc_reserved[2]._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
            ,0x29,"r","==","0",(long)stat_buf.__glibc_reserved[2]._4_4_,"==",0);
    abort();
  }
  stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop);
  if (stat_buf.__glibc_reserved[2]._4_4_ == -1) {
    close_loop(loop_00);
    iVar1 = uv_loop_close(loop_00);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x2f,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
      abort();
    }
    uv_library_shutdown();
    fprintf(_stderr,"%s\n","Insufficient privileges to alter pipe fmode");
    fflush(_stderr);
    pipe_handle.pipe_fname._4_4_ = 7;
  }
  else {
    if ((long)stat_buf.__glibc_reserved[2]._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x32,"r","==","0",(long)stat_buf.__glibc_reserved[2]._4_4_,"==",0);
      abort();
    }
    memset(&eval_a,0,0x90);
    iVar1 = stat64("/tmp/uv-test-sock",(stat64 *)&eval_a);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x35,"stat(\"/tmp/uv-test-sock\", &stat_buf)","==","0",(long)iVar1,"==",0);
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x100) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x36,"stat_buf.st_mode & S_IRUSR");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x20) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x37,"stat_buf.st_mode & S_IRGRP");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 4) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x38,"stat_buf.st_mode & S_IROTH");
      abort();
    }
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop,2);
    if ((long)stat_buf.__glibc_reserved[2]._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x3c,"r","==","0",(long)stat_buf.__glibc_reserved[2]._4_4_,"==",0);
      abort();
    }
    stat64("/tmp/uv-test-sock",(stat64 *)&eval_a);
    if (((uint)stat_buf.st_nlink & 0x80) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x3f,"stat_buf.st_mode & S_IWUSR");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x10) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x40,"stat_buf.st_mode & S_IWGRP");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 2) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x41,"stat_buf.st_mode & S_IWOTH");
      abort();
    }
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop,3);
    if ((long)stat_buf.__glibc_reserved[2]._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x45,"r","==","0",(long)stat_buf.__glibc_reserved[2]._4_4_,"==",0);
      abort();
    }
    stat64("/tmp/uv-test-sock",(stat64 *)&eval_a);
    if (((uint)stat_buf.st_nlink & 0x100) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x48,"stat_buf.st_mode & S_IRUSR");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x20) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x49,"stat_buf.st_mode & S_IRGRP");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 4) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x4a,"stat_buf.st_mode & S_IROTH");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x80) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x4b,"stat_buf.st_mode & S_IWUSR");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 0x10) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x4c,"stat_buf.st_mode & S_IWGRP");
      abort();
    }
    if (((uint)stat_buf.st_nlink & 2) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x4d,"stat_buf.st_mode & S_IWOTH");
      abort();
    }
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(0,3);
    if ((long)stat_buf.__glibc_reserved[2]._4_4_ != -9) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x51,"r","==","UV_EBADF",(long)stat_buf.__glibc_reserved[2]._4_4_,"==",
              0xfffffffffffffff7);
      abort();
    }
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop,data + 0x845e2e);
    if ((long)stat_buf.__glibc_reserved[2]._4_4_ != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x54,"r","==","UV_EINVAL",(long)stat_buf.__glibc_reserved[2]._4_4_,"==",
              0xffffffffffffffea);
      abort();
    }
    uv_close(&loop,0);
    stat_buf.__glibc_reserved[2]._4_4_ = uv_pipe_chmod(&loop,3);
    if ((long)stat_buf.__glibc_reserved[2]._4_4_ != -9) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x58,"r","==","UV_EBADF",(long)stat_buf.__glibc_reserved[2]._4_4_,"==",
              0xfffffffffffffff7);
      abort();
    }
    close_loop(loop_00);
    iVar1 = uv_loop_close(loop_00);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-fchmod.c"
              ,0x5a,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
      abort();
    }
    uv_library_shutdown();
    pipe_handle.pipe_fname._4_4_ = 0;
  }
  return pipe_handle.pipe_fname._4_4_;
}

Assistant:

TEST_IMPL(pipe_set_chmod) {
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;
  int r;
#ifndef _WIN32
  struct stat stat_buf;
#endif

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  /* No easy way to test if this works, we will only make sure that the call is
   * successful. */
  r = uv_pipe_chmod(&pipe_handle, UV_READABLE);
  if (r == UV_EPERM) {
    MAKE_VALGRIND_HAPPY(loop);
    RETURN_SKIP("Insufficient privileges to alter pipe fmode");
  }
  ASSERT_OK(r);
#ifndef _WIN32
  memset(&stat_buf, 0, sizeof(stat_buf));
  ASSERT_OK(stat(TEST_PIPENAME, &stat_buf));
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE);
  ASSERT_OK(r);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT_OK(r);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(NULL, UV_WRITABLE | UV_READABLE);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_pipe_chmod(&pipe_handle, 12345678);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&pipe_handle, NULL);
  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT_EQ(r, UV_EBADF);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}